

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O3

void ssh2_bare_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  _Bool *p_Var1;
  int type;
  uchar *puVar2;
  LogContext *ctx;
  int n_blanks;
  uint8_t *p;
  PktOut *pkt;
  char *texttype;
  uint uVar3;
  PktOutQueue *pPVar4;
  size_t len;
  ptrlen pkt_00;
  logblank_t local_68 [4];
  
  pPVar4 = &bpp->out_pq;
  pkt = (*(bpp->out_pq).after)(&pPVar4->pqb,(PacketQueueNode *)pPVar4,true);
  if (pkt != (PktOut *)0x0) {
    do {
      if (bpp->logctx != (LogContext *)0x0) {
        puVar2 = pkt->data;
        len = pkt->length - 5;
        pkt_00.len = len;
        pkt_00.ptr = puVar2 + 5;
        n_blanks = ssh2_censor_packet(bpp->pls,pkt->type,true,pkt_00,local_68);
        ctx = bpp->logctx;
        type = pkt->type;
        texttype = ssh2_pkt_type(bpp->pls->kctx,bpp->pls->actx,type);
        log_packet(ctx,1,type,texttype,puVar2 + 5,len,n_blanks,local_68,
                   (unsigned_long *)&bpp[-1].ic_out_pq.queued,pkt->downstream_id,
                   pkt->additional_log_text);
      }
      p_Var1 = &bpp[-1].ic_out_pq.queued;
      *(long *)p_Var1 = *(long *)p_Var1 + 1;
      uVar3 = (int)pkt->length - 4;
      *(uint *)pkt->data =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 * 0x1000000;
      bufchain_add(bpp->out_raw,pkt->data,pkt->length);
      ssh_free_pktout(pkt);
      pkt = (*(bpp->out_pq).after)(&pPVar4->pqb,(PacketQueueNode *)pPVar4,true);
    } while (pkt != (PktOut *)0x0);
  }
  ssh_sendbuffer_changed(bpp->ssh);
  return;
}

Assistant:

static void ssh2_bare_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh2_bare_bpp_state *s =
        container_of(bpp, struct ssh2_bare_bpp_state, bpp);
    PktOut *pkt;

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        ssh2_bare_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);
    }

    ssh_sendbuffer_changed(bpp->ssh);
}